

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

Schema __thiscall capnp::SchemaLoader::loadOnce(SchemaLoader *this,Reader *reader)

{
  Own<capnp::SchemaLoader::Impl,_std::nullptr_t> *pOVar1;
  Impl *pIVar2;
  RawSchema *pRVar3;
  undefined1 local_48 [8];
  TryGetResult getResult;
  undefined1 local_30 [8];
  Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> locked;
  Reader *reader_local;
  SchemaLoader *this_local;
  
  locked.ptr = (Own<capnp::SchemaLoader::Impl,_std::nullptr_t> *)reader;
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_30,this);
  pOVar1 = kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::operator->
                     ((Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_30);
  pIVar2 = kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>::get(pOVar1);
  capnp::schema::Node::Reader::getId((Reader *)locked.ptr);
  Impl::tryGet((Impl *)local_48,(uint64_t)pIVar2);
  if ((local_48 == (undefined1  [8])0x0) || (*(long *)((long)local_48 + 0x40) != 0)) {
    pOVar1 = kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::operator->
                       ((Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_30);
    pIVar2 = kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>::get(pOVar1);
    pRVar3 = Impl::load(pIVar2,(Reader *)locked.ptr,false);
    Schema::Schema((Schema *)&this_local,&pRVar3->defaultBrand);
  }
  else {
    Schema::Schema((Schema *)&this_local,(RawBrandedSchema *)((long)local_48 + 0x48));
  }
  kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_30);
  return (Schema)(RawBrandedSchema *)this_local;
}

Assistant:

Schema SchemaLoader::loadOnce(const schema::Node::Reader& reader) const {
  auto locked = impl.lockExclusive();
  auto getResult = locked->get()->tryGet(reader.getId());
  if (getResult.schema == nullptr || getResult.schema->lazyInitializer != nullptr) {
    // Doesn't exist yet, or the existing schema is a placeholder and therefore has not yet been
    // seen publicly.  Go ahead and load the incoming reader.
    return Schema(&locked->get()->load(reader, false)->defaultBrand);
  } else {
    return Schema(&getResult.schema->defaultBrand);
  }
}